

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::
write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,decimal_fp<float> *fp,
          basic_format_specs<char> *specs,float_specs fspecs,char decimal_point)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar5;
  char cVar6;
  size_t size;
  long lVar8;
  int iVar9;
  int iVar10;
  undefined7 in_register_00000081;
  ulong uVar11;
  int num_zeros;
  sign_t sign;
  int significand_size;
  significand_type significand;
  basic_format_specs<char> *local_a8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_a0;
  int local_98;
  uint local_94;
  significand_type local_90;
  int exp;
  float_specs fspecs_local;
  anon_class_28_7_94dcc806 write;
  undefined4 uStack_5c;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  ulong uVar7;
  
  local_94 = (uint)CONCAT71(in_register_00000081,decimal_point);
  significand = fp->significand;
  local_a8 = specs;
  local_a0.container = out.container;
  local_90 = significand;
  fspecs_local = fspecs;
  iVar3 = get_significand_size<float>(fp);
  uVar1 = fspecs._4_4_;
  sign = uVar1 >> 8 & 0xff;
  uVar11 = (ulong)((uint)(sign != none) + iVar3);
  iVar10 = fp->exponent;
  local_98 = iVar10 + iVar3 + -1;
  significand_size = iVar3;
  use_exp_format.fspecs = fspecs;
  use_exp_format.output_exp = local_98;
  bVar2 = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
          ::anon_class_12_2_f0c9b3c6::operator()(&use_exp_format);
  iVar9 = fspecs.precision;
  if (bVar2) {
    if ((uVar1 >> 0x14 & 1) == 0) {
      uVar4 = 0;
      uVar7 = (ulong)(local_94 & 0xff);
      if (iVar3 == 1) {
        uVar7 = uVar4;
      }
      cVar6 = (char)uVar7;
    }
    else {
      uVar4 = 0;
      if (0 < iVar9 - iVar3) {
        uVar4 = (ulong)(uint)(iVar9 - iVar3);
      }
      uVar11 = uVar11 + uVar4;
      cVar6 = (char)local_94;
    }
    write._0_8_ = CONCAT44(local_90,uVar1 >> 8) & 0xffffffff000000ff;
    write.decimal_point = cVar6;
    write.significand_size = iVar3;
    write._16_8_ = CONCAT35(write._21_3_,CONCAT14(((uVar1 >> 0x10 & 1) == 0) << 5,(int)uVar4)) |
                   0x4500000000;
    stack0xffffffffffffffa0 = (decimal_fp<float> *)CONCAT44(uStack_5c,local_98);
    if (0 < local_a8->width) {
      iVar10 = iVar10 + iVar3;
      iVar3 = local_98;
      if (iVar10 < 1) {
        iVar3 = 1 - iVar10;
      }
      lVar8 = 2;
      if (99 < iVar3) {
        lVar8 = (ulong)(999 < iVar3) + 3;
      }
      bVar5 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_&>
                        (local_a0,local_a8,uVar11 + (3 - (ulong)(cVar6 == '\0')) + lVar8,&write);
      return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar5.container;
    }
    bVar5 = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
            ::anon_class_28_7_94dcc806::operator()(&write,local_a0.container);
    return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar5.container;
  }
  iVar10 = fp->exponent;
  exp = iVar10 + iVar3;
  if ((long)iVar10 < 0) {
    if (0 < exp) {
      num_zeros = iVar9 - iVar3 & (int)(uVar1 << 0xb) >> 0x1f;
      uVar1 = num_zeros;
      if (num_zeros < 1) {
        uVar1 = 0;
      }
      write._0_8_ = &sign;
      write._8_8_ = &significand;
      write._16_8_ = &significand_size;
      unique0x00004e80 = (decimal_fp<float> *)&exp;
      bVar5 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_3_>
                        (local_a0,local_a8,(ulong)uVar1 + 1 + uVar11,
                         (anon_class_48_6_48d028d1 *)&write);
      return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar5.container;
    }
    iVar10 = -exp;
    num_zeros = iVar10;
    if (SBORROW4(iVar9,iVar10) != iVar9 + exp < 0) {
      num_zeros = iVar9;
    }
    if (iVar9 < 0) {
      num_zeros = iVar10;
    }
    if (iVar3 != 0) {
      num_zeros = iVar10;
    }
    write._8_8_ = &num_zeros;
    write._0_8_ = &sign;
    write._16_8_ = &significand_size;
    unique0x00004e80 = (decimal_fp<float> *)&fspecs_local;
    bVar5 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_4_>
                      (local_a0,local_a8,(num_zeros + 2) + uVar11,(anon_class_48_6_9afe1116 *)&write
                      );
    return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar5.container;
  }
  size = (long)iVar10 + uVar11;
  num_zeros = iVar9 - exp;
  uVar11 = (ulong)(uint)num_zeros;
  if ((uVar1 >> 0x14 & 1) != 0) {
    if (fspecs._4_1_ == '\x02' || 0 < num_zeros) {
      if (num_zeros < 1) goto LAB_00181f82;
    }
    else {
      num_zeros = 1;
      uVar11 = 1;
    }
    size = size + uVar11;
  }
LAB_00181f82:
  write._0_8_ = &sign;
  write._8_8_ = &significand;
  write._16_8_ = &significand_size;
  unique0x10000286 = fp;
  bVar5 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_2_>
                    (local_a0,local_a8,size,(anon_class_56_7_a2a26a24 *)&write);
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar5.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}